

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitLir.c
# Opt level: O0

void sljit_free_compiler(sljit_compiler *compiler)

{
  void *allocator_data_00;
  sljit_memory_fragment *psVar1;
  void *allocator_data;
  sljit_memory_fragment *curr;
  sljit_memory_fragment *buf;
  sljit_compiler *compiler_local;
  
  allocator_data_00 = compiler->allocator_data;
  curr = compiler->buf;
  while (curr != (sljit_memory_fragment *)0x0) {
    psVar1 = curr->next;
    pcre2_jit_free(curr,allocator_data_00);
    curr = psVar1;
  }
  curr = compiler->abuf;
  while (curr != (sljit_memory_fragment *)0x0) {
    psVar1 = curr->next;
    pcre2_jit_free(curr,allocator_data_00);
    curr = psVar1;
  }
  pcre2_jit_free(compiler,allocator_data_00);
  return;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE void sljit_free_compiler(struct sljit_compiler *compiler)
{
	struct sljit_memory_fragment *buf;
	struct sljit_memory_fragment *curr;
	void *allocator_data = compiler->allocator_data;
	SLJIT_UNUSED_ARG(allocator_data);

	buf = compiler->buf;
	while (buf) {
		curr = buf;
		buf = buf->next;
		SLJIT_FREE(curr, allocator_data);
	}

	buf = compiler->abuf;
	while (buf) {
		curr = buf;
		buf = buf->next;
		SLJIT_FREE(curr, allocator_data);
	}

#if (defined SLJIT_CONFIG_ARM_V5 && SLJIT_CONFIG_ARM_V5)
	SLJIT_FREE(compiler->cpool, allocator_data);
#endif
	SLJIT_FREE(compiler, allocator_data);
}